

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamOutBinary * __thiscall
chrono::ChStreamOutBinary::operator<<(ChStreamOutBinary *this,double Val)

{
  _func_int **pp_Var1;
  double *ptData;
  double Val_local;
  double tmp;
  
  Val_local = Val;
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    ptData = &tmp;
    tmp = Val;
    StreamSwapBytes<double>(ptData);
    pp_Var1 = (this->super_ChStreamOut)._vptr_ChStreamOut;
  }
  else {
    pp_Var1 = (this->super_ChStreamOut)._vptr_ChStreamOut;
    ptData = &Val_local;
  }
  (*pp_Var1[2])(this,ptData,8);
  return this;
}

Assistant:

ChStreamOutBinary& ChStreamOutBinary::operator<<(const double Val) {
    if (big_endian_machine) {
        double tmp = Val;
        StreamSwapBytes<double>(&tmp);
        this->Output((char*)&tmp, sizeof(double));
    } else {
        this->Output((char*)&Val, sizeof(double));
    }
    return (*this);
}